

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O2

void pce_defchr(int *ip)

{
  char last_char;
  int iVar1;
  char *stptr;
  long lVar2;
  uint data [8];
  
  data_loccnt = loccnt;
  data_size = 3;
  data_level = data_size;
  if (lablptr == (t_symbol *)0x0) {
LAB_0010fb6f:
    lVar2 = 0;
    while( true ) {
      if (lVar2 == 8) {
        pce_pack_8x8_tile(buffer,data,0,2);
        putbuffer(buffer,0x20);
        if (pass != 1) {
          return;
        }
        println();
        return;
      }
      last_char = ',';
      if (lVar2 == 7) {
        last_char = ';';
      }
      iVar1 = evaluate(ip,last_char);
      if (iVar1 == 0) break;
      data[lVar2] = value;
      lVar2 = lVar2 + 1;
    }
    return;
  }
  labldef(loccnt,1);
  iVar1 = evaluate(ip,',');
  if (iVar1 == 0) {
    return;
  }
  if (value < 0x7f00) {
    lablptr->vram = value;
    iVar1 = evaluate(ip,',');
    if (iVar1 == 0) {
      return;
    }
    if (value < 0x10) {
      lablptr->pal = value;
      goto LAB_0010fb6f;
    }
    stptr = "Incorrect palette index!";
  }
  else {
    stptr = "Incorrect VRAM address!";
  }
  error(stptr);
  return;
}

Assistant:

void
pce_defchr(int *ip)
{
	unsigned int data[8];
	int size;
	int i;

	/* output infos */
	data_loccnt = loccnt;
	data_size   = 3;
	data_level  = 3;

	/* check if there's a label */
	if (lablptr) {
		/* define label */
		labldef(loccnt, 1);

		/* get the VRAM address */
		if (!evaluate(ip, ','))
			return;
		if (value >= 0x7F00) {
			error("Incorrect VRAM address!");
			return;
		}
		lablptr->vram = value;
	
		/* get the default palette */
		if (!evaluate(ip, ','))
			return;
		if (value > 0x0F) {
			error("Incorrect palette index!");
			return;
		}
		lablptr->pal = value;
	}

	/* get tile data */
	for (i = 0; i < 8; i++) {
		/* get value */
		if (!evaluate(ip, (i < 7) ? ',' : ';'))
			return;

		/* store value */
		data[i] = value;
	}

	/* encode tile */
	size = pce_pack_8x8_tile(buffer, data, 0, PACKED_TILE);

	/* store tile */
	putbuffer(buffer, size);

	/* output line */
	if (pass == LAST_PASS)
		println();
}